

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O2

void mcpl_transfer_last_read_particle(mcpl_file_t source,mcpl_outfile_t target)

{
  double dVar1;
  double dVar2;
  int iVar3;
  long lVar4;
  byte bVar5;
  uint i;
  ulong __n;
  long lVar6;
  long lVar7;
  void *__dest;
  void *__src;
  
  if (*(long *)((long)source.internal + 0x88) == 0) {
    dVar1 = *(double *)(*(long *)((long)source.internal + 0x90) + 0x58);
    if (((dVar1 == 0.0) && (!NAN(dVar1))) &&
       (*(int *)(*(long *)((long)source.internal + 0x90) + 0x60) == 0)) {
      mcpl_error(
                "mcpl_transfer_last_read_particle called with source file in invalid state (did you forget to first call mcpl_read() on the source file before calling this function?)"
                );
    }
  }
  if ((*(int *)((long)target.internal + 0x54) != 0) &&
     (*(int *)(*(long *)((long)source.internal + 0x90) + 0x60) !=
      *(int *)((long)target.internal + 0x54))) {
    printf(
          "MCPL ERROR: mcpl_transfer_last_read_particle asked to transfer particle with pdgcode %li into a file with universal pdgcode of %li\n"
          );
    mcpl_error("mcpl_transfer_last_read_particle got incompatible pdgcode\n");
  }
  dVar1 = *(double *)((long)target.internal + 0x58);
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    dVar2 = *(double *)(*(long *)((long)source.internal + 0x90) + 0x58);
    if ((dVar2 != dVar1) || (NAN(dVar2) || NAN(dVar1))) {
      printf(
            "MCPL ERROR: mcpl_transfer_last_read_particle asked to transfer particle with weight %g into a file with universal weight of %g\n"
            );
      mcpl_error("mcpl_transfer_last_read_particle got incompatible weight\n");
    }
  }
  if ((*(int *)((long)source.internal + 0x18) == 2) ||
     ((*(int *)((long)source.internal + 0x24) != 0 && (*(int *)((long)target.internal + 0x50) == 0))
     )) {
    mcpl_add_particle(target,*(mcpl_particle_t **)((long)source.internal + 0x90));
    return;
  }
  if (*(int *)((long)target.internal + 0x80) == *(int *)((long)source.internal + 0x98)) {
    if (*(uint *)((long)source.internal + 0x78) != *(uint *)((long)target.internal + 0x70)) {
      mcpl_error("unexpectedly inconsistent particle sizes");
    }
    __dest = target.internal + 0x84;
    __src = source.internal + 0x9c;
    __n = (ulong)*(uint *)((long)source.internal + 0x78);
  }
  else {
    mcpl_internal_serialise_particle_to_buffer
              (*(mcpl_particle_t **)((long)source.internal + 0x90),
               (mcpl_outfileinternal_t *)target.internal);
    iVar3 = *(int *)((long)target.internal + 0x50);
    bVar5 = iVar3 != 0 ^ 3;
    lVar4 = (ulong)(*(int *)((long)target.internal + 0x4c) != 0) * 3 + 3 << bVar5;
    lVar7 = (ulong)(*(int *)((long)source.internal + 0x20) != 0) * 3 + 3 << bVar5;
    if (*(int *)((long)source.internal + 0x24) != iVar3) {
      if (*(int *)((long)source.internal + 0x24) == 0 && iVar3 != 0) {
        for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
          *(float *)((long)target.internal + lVar6 * 4 + lVar4 + 0x84) =
               (float)*(double *)((long)source.internal + lVar6 * 8 + lVar7 + 0x9c);
        }
      }
      goto LAB_00104660;
    }
    __dest = target.internal + lVar4 + 0x84;
    __src = source.internal + lVar7 + 0x9c;
    __n = 0x18;
    if (iVar3 != 0) {
      __n = 0xc;
    }
  }
  memcpy(__dest,__src,__n);
LAB_00104660:
  mcpl_internal_write_particle_buffer_to_file((mcpl_outfileinternal_t *)target.internal);
  return;
}

Assistant:

void mcpl_transfer_last_read_particle(mcpl_file_t source, mcpl_outfile_t target)
{
  mcpl_outfileinternal_t * ft = (mcpl_outfileinternal_t *)target.internal;
  assert(ft);
  mcpl_fileinternal_t * fs = (mcpl_fileinternal_t *)source.internal;
  assert(fs);

  if ( fs->current_particle_idx==0 && fs->particle->weight==0.0 && fs->particle->pdgcode==0 ) {
    mcpl_error("mcpl_transfer_last_read_particle called with source file in invalid state"
               " (did you forget to first call mcpl_read() on the source file before calling this function?)");
    return;
  }

  //Sanity checks for universal fields here (but not in mcpl_add_particle since users are allowed to create files by setting just the universal fields):
  if ( ft->opt_universalpdgcode && fs->particle->pdgcode != ft->opt_universalpdgcode) {
    printf("MCPL ERROR: mcpl_transfer_last_read_particle asked to transfer particle with pdgcode %li into a file with universal pdgcode of %li\n",
           (long)fs->particle->pdgcode,(long)ft->opt_universalpdgcode);
    mcpl_error("mcpl_transfer_last_read_particle got incompatible pdgcode\n");
    return;
  }
  if ( ft->opt_universalweight && fs->particle->weight != ft->opt_universalweight) {
    printf("MCPL ERROR: mcpl_transfer_last_read_particle asked to transfer particle with weight %g into a file with universal weight of %g\n",
           fs->particle->weight,ft->opt_universalweight);
    mcpl_error("mcpl_transfer_last_read_particle got incompatible weight\n");
    return;
  }
  //NB: We don't sanity check that polarisation/userflags are enabled if present
  //in the input particle, since it is a valid use-case to use this function to
  //discard such info.

  if ( fs->format_version == 2 || ( fs->opt_singleprec && !ft->opt_singleprec ) ) {
    //source file is in old format with different unit vector packing, or the
    //floating point precision is increasing. In these scenarious we can not
    //reuse the 3 floats representing packed direction+ekin but must proceed via
    //a full unpacking+repacking.
    mcpl_add_particle(target,fs->particle);
    return;
  }

  if ( ft->opt_signature == fs->opt_signature ) {
    //Particle data is encoded in exactly the same manner in src and target (a
    //common scenario for many merge or extraction scenarios) -> simply transfer
    //the bytes and be done with it:
    if ( fs->particle_size!=ft->particle_size )
      mcpl_error("unexpectedly inconsistent particle sizes");
    memcpy(ft->particle_buffer,fs->particle_buffer,fs->particle_size);
    mcpl_internal_write_particle_buffer_to_file(ft);
    return;
  }

  //The hard way - first serialise the source particle into the output buffer:
  mcpl_internal_serialise_particle_to_buffer( fs->particle, ft );

  //If possible, override the 3 FP representing packed ekin+dir from the packing
  //in the source, thus avoiding potentially lossy unpacking+packing:
  size_t fpsize_target = ft->opt_singleprec ? sizeof(float) : sizeof(double);
  size_t idx_packekindir_target = (ft->opt_polarisation ? 6 : 3) * fpsize_target;
  size_t idx_packekindir_src = (fs->opt_polarisation ? 6 : 3) * fpsize_target;
  if (fs->opt_singleprec == ft->opt_singleprec) {
    memcpy( &(ft->particle_buffer[idx_packekindir_target]),
            &(fs->particle_buffer[idx_packekindir_src]),
            fpsize_target * 3);
  } else if ( ft->opt_singleprec && !fs->opt_singleprec ) {
    //For the case of double precision -> single precision, we can simply
    //perform a narrowing conversion:
    double * packekindir_src = (double*)&(fs->particle_buffer[idx_packekindir_src]);
    float * packekindir_target = (float*)&(ft->particle_buffer[idx_packekindir_target]);
    for (unsigned i = 0; i < 3; ++i) {
      packekindir_target[i] = (float)packekindir_src[i];
    }
  }

  mcpl_internal_write_particle_buffer_to_file(ft);
}